

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O1

void __thiscall
amrex::STLtools::fill
          (STLtools *this,MultiFab *mf,IntVect *nghost,Geometry *geom,Real outside_value,
          Real inside_value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  pointer pTVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  pointer pTVar22;
  int iVar23;
  XDim3 *pXVar24;
  double dVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  byte bVar29;
  int iVar30;
  uint uVar31;
  int *piVar32;
  int iVar33;
  double *pdVar34;
  double *pdVar35;
  Real *pRVar36;
  Array4<double> *pAVar37;
  int iVar38;
  uint uVar39;
  long lVar40;
  bool bVar41;
  undefined4 uVar42;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  MFIter mfi;
  double dStack_4c0;
  double dStack_480;
  ulong local_420;
  Real local_410;
  Real local_408;
  int local_400;
  int local_3fc;
  double local_3f8;
  undefined8 uStack_3f0;
  double local_3e8;
  undefined8 uStack_3e0;
  double local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  undefined1 local_3b8 [16];
  double local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  undefined8 uStack_390;
  double local_388;
  undefined8 uStack_380;
  double local_378;
  double local_370;
  Real local_368;
  Real local_360;
  undefined1 local_358 [16];
  double local_348;
  undefined8 uStack_340;
  double local_338;
  ulong uStack_330;
  Real local_328;
  undefined8 uStack_320;
  Real local_318;
  undefined8 uStack_310;
  Box local_304;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  ulong uStack_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  Array4<double> *local_2a8;
  IntVect *local_2a0;
  Real local_298;
  Real local_290;
  Real local_288;
  Real local_280;
  long local_278;
  long local_270;
  undefined1 local_268 [16];
  double local_258;
  undefined8 uStack_250;
  Real local_248;
  undefined8 uStack_240;
  Real local_238;
  undefined8 uStack_230;
  double local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  double local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  ulong uStack_1d0;
  double local_1c8;
  ulong uStack_1c0;
  double local_1b8;
  ulong uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  double local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  double local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  MFIter local_90;
  
  local_328 = inside_value;
  local_318 = outside_value;
  if (this->m_boundry_is_outside == false) {
    local_328 = outside_value;
    local_318 = inside_value;
  }
  uVar8 = this->m_num_tri;
  dVar1 = (geom->prob_domain).xlo[0];
  local_280 = (geom->prob_domain).xlo[1];
  local_290 = (geom->prob_domain).xlo[2];
  dVar2 = (geom->super_CoordSys).dx[0];
  local_288 = (geom->super_CoordSys).dx[1];
  local_298 = (geom->super_CoordSys).dx[2];
  pTVar9 = (this->m_tri_pts_d).m_data;
  local_238 = (this->m_ptmin).x;
  uStack_230 = 0;
  dVar3 = (this->m_ptmin).y;
  dVar4 = (this->m_ptmin).z;
  local_248 = (this->m_ptmax).x;
  uStack_240 = 0;
  local_360 = (this->m_ptmax).y;
  local_368 = (this->m_ptmax).z;
  dVar5 = (this->m_ptref).x;
  dVar6 = (this->m_ptref).y;
  dVar7 = (this->m_ptref).z;
  local_2a0 = nghost;
  FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            (&mf->super_FabArray<amrex::FArrayBox>);
  local_2a8 = (mf->super_FabArray<amrex::FArrayBox>).m_arrays.hp;
  local_408 = local_318;
  local_410 = local_328;
  local_304.smallend.vect[0] = CONCAT13(local_304.smallend.vect[0]._3_1_,0x10000);
  local_304.smallend.vect[1] = Gpu::Device::max_gpu_streams;
  local_304.smallend.vect[0] = CONCAT22(local_304.smallend.vect[0]._2_2_,1);
  local_304.smallend.vect[2] = (undefined4)FabArrayBase::mfiter_tile_size;
  local_304.bigend.vect[0] = FabArrayBase::mfiter_tile_size._4_4_;
  local_304.bigend.vect[1] = DAT_0083cec0;
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,(MFItInfo *)&local_304);
  if (local_90.currentIndex < local_90.endIndex) {
    local_228 = -dVar6;
    uStack_220 = 0x8000000000000000;
    local_2b8._0_8_ = -dVar7;
    local_2b8._8_8_ = 0x8000000000000000;
    do {
      MFIter::growntilebox(&local_304,&local_90,local_2a0);
      iVar28 = local_304.bigend.vect[1];
      iVar27 = local_304.smallend.vect[1];
      iVar26 = local_304.smallend.vect[0];
      piVar32 = &local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar32 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_90.currentIndex;
      }
      local_420 = local_304._8_8_ & 0xffffffff;
      local_400 = local_304.bigend.vect[2];
      uVar42 = SUB84(local_360,0);
      uVar51 = (undefined4)((ulong)local_360 >> 0x20);
      if (local_304.smallend.vect[2] <= local_304.bigend.vect[2]) {
        pAVar37 = local_2a8 + *piVar32;
        local_3fc = local_304.bigend.vect[0];
        dVar54 = local_238;
        dVar48 = local_248;
        dVar53 = local_368;
        iVar33 = local_304.bigend.vect[0];
        do {
          iVar30 = (int)local_420;
          if (iVar27 <= iVar28) {
            dVar14 = (double)iVar30 * local_298 + local_290;
            local_c8 = dVar14;
            if (dVar14 <= dVar7) {
              local_c8 = dVar7;
            }
            uStack_c0 = 0;
            local_138 = dVar14;
            if (dVar7 <= dVar14) {
              local_138 = dVar7;
            }
            uStack_130 = 0;
            dVar10 = dVar7 - dVar14;
            local_218._0_8_ = -dVar14;
            uStack_200 = 0x8000000000000000;
            local_218._8_4_ = SUB84(dVar14,0);
            local_218._12_4_ = (int)((ulong)local_218._0_8_ >> 0x20);
            local_268._8_8_ = dVar14;
            local_268._0_8_ = local_218._0_8_;
            local_188._8_8_ = 0;
            local_188._0_8_ = dVar10;
            local_198._8_4_ = SUB84(dVar10,0);
            local_198._0_8_ = dVar10;
            local_198._12_4_ = (int)((ulong)dVar10 >> 0x20);
            lVar40 = (long)iVar30;
            local_278 = lVar40;
            local_208 = local_218._0_8_;
            iVar23 = iVar27;
            do {
              if (iVar26 <= iVar33) {
                dVar10 = (double)iVar23 * local_288 + local_280;
                local_a8 = dVar10;
                if (dVar10 <= dVar6) {
                  local_a8 = dVar6;
                }
                uStack_a0 = 0;
                local_b8 = dVar10;
                if (dVar6 <= dVar10) {
                  local_b8 = dVar6;
                }
                uStack_b0 = 0;
                dVar18 = dVar6 * dVar14 + dVar10 * (double)local_2b8._0_8_;
                local_158 = dVar10 - dVar6;
                local_1f8._0_8_ = -dVar10;
                uStack_1e0 = 0x8000000000000000;
                local_1f8._8_4_ = SUB84(dVar10,0);
                local_1f8._12_4_ = (int)((ulong)local_1f8._0_8_ >> 0x20);
                uStack_150 = 0;
                local_168._8_4_ = SUB84(local_158,0);
                local_168._0_8_ = local_158;
                local_168._12_4_ = (int)((ulong)local_158 >> 0x20);
                local_148._8_8_ = 0;
                local_148._0_8_ = dVar18;
                local_178._8_4_ = SUB84(dVar18,0);
                local_178._0_8_ = dVar18;
                local_178._12_4_ = (int)((ulong)dVar18 >> 0x20);
                local_270 = (long)iVar23;
                iVar38 = iVar26;
                local_1e8 = local_1f8._0_8_;
                do {
                  pRVar36 = &local_408;
                  dVar18 = (double)iVar38 * dVar2 + dVar1;
                  if (((((dVar3 <= dVar10 && dVar10 <= (double)CONCAT44(uVar51,uVar42)) &&
                        dVar4 <= dVar14) && dVar14 <= dVar53) && 0 < (int)uVar8) &&
                      (dVar54 <= dVar18 && dVar18 <= dVar48)) {
                    local_318 = dVar18;
                    if (dVar18 <= dVar5) {
                      local_318 = dVar5;
                    }
                    uStack_310 = 0;
                    local_328 = dVar18;
                    if (dVar5 <= dVar18) {
                      local_328 = dVar5;
                    }
                    uStack_320 = 0;
                    local_118 = dVar5 * dVar10 + dVar18 * local_228;
                    dVar54 = dVar5 * dVar14 + dVar18 * (double)local_2b8._0_8_;
                    local_108 = dVar5 - dVar18;
                    uStack_f0 = 0;
                    uStack_d0 = 0;
                    local_e8._8_8_ = 0;
                    local_e8._0_8_ = dVar54;
                    local_128._8_4_ = SUB84(dVar54,0);
                    local_128._0_8_ = dVar54;
                    local_128._12_4_ = (int)((ulong)dVar54 >> 0x20);
                    lVar40 = 0;
                    uVar39 = 0;
                    dStack_110 = local_118;
                    dStack_100 = local_108;
                    local_f8 = local_108;
                    local_d8 = local_118;
                    do {
                      dVar54 = *(double *)((long)&(pTVar9->v1).x + lVar40);
                      dVar48 = *(double *)((long)&(pTVar9->v2).x + lVar40);
                      dVar53 = *(double *)((long)&(pTVar9->v3).x + lVar40);
                      dVar44 = dVar48;
                      if (dVar54 <= dVar48) {
                        dVar44 = dVar54;
                      }
                      dVar43 = dVar53;
                      if (dVar44 <= dVar53) {
                        dVar43 = dVar44;
                      }
                      iVar33 = 0;
                      if (dVar43 <= local_318) {
                        pTVar22 = (pointer)&pTVar9->v2;
                        if (dVar48 <= dVar54) {
                          pTVar22 = pTVar9;
                        }
                        pdVar34 = (double *)((long)&(pTVar22->v1).x + lVar40);
                        if (*pdVar34 <= dVar53 && dVar53 != *pdVar34) {
                          pdVar34 = (double *)((long)&(pTVar9->v3).x + lVar40);
                        }
                        iVar33 = 0;
                        if (local_328 < *pdVar34 || local_328 == *pdVar34) {
                          dVar44 = *(double *)((long)&(pTVar9->v1).y + lVar40);
                          dVar43 = *(double *)((long)&(pTVar9->v2).y + lVar40);
                          dVar49 = *(double *)((long)&(pTVar9->v3).y + lVar40);
                          uVar42 = SUB84(dVar43,0);
                          uVar51 = (int)((ulong)dVar43 >> 0x20);
                          if (dVar44 <= dVar43) {
                            uVar42 = SUB84(dVar44,0);
                            uVar51 = (int)((ulong)dVar44 >> 0x20);
                          }
                          dVar47 = dVar49;
                          if ((double)CONCAT44(uVar51,uVar42) <= dVar49) {
                            dVar47 = (double)CONCAT44(uVar51,uVar42);
                          }
                          if (dVar47 <= local_a8) {
                            pXVar24 = &pTVar9->v2;
                            if (dVar43 <= dVar44) {
                              pXVar24 = &pTVar9->v1;
                            }
                            pdVar34 = (double *)((long)&pXVar24->y + lVar40);
                            if (*pdVar34 <= dVar49 && dVar49 != *pdVar34) {
                              pdVar34 = (double *)((long)&(pTVar9->v3).y + lVar40);
                            }
                            iVar33 = 0;
                            if (local_b8 < *pdVar34 || local_b8 == *pdVar34) {
                              dVar47 = *(double *)((long)&(pTVar9->v1).z + lVar40);
                              dVar46 = *(double *)((long)&(pTVar9->v2).z + lVar40);
                              dVar45 = *(double *)((long)&(pTVar9->v3).z + lVar40);
                              uVar42 = SUB84(dVar46,0);
                              uVar51 = (int)((ulong)dVar46 >> 0x20);
                              if (dVar47 <= dVar46) {
                                uVar42 = SUB84(dVar47,0);
                                uVar51 = (int)((ulong)dVar47 >> 0x20);
                              }
                              dVar11 = dVar45;
                              if ((double)CONCAT44(uVar51,uVar42) <= dVar45) {
                                dVar11 = (double)CONCAT44(uVar51,uVar42);
                              }
                              if (dVar11 <= local_c8) {
                                pXVar24 = &pTVar9->v2;
                                if (dVar46 <= dVar47) {
                                  pXVar24 = &pTVar9->v1;
                                }
                                pdVar35 = (double *)((long)&pXVar24->z + lVar40);
                                pdVar34 = (double *)((long)&(pTVar9->v3).z + lVar40);
                                if (*pdVar35 <= dVar45 && dVar45 != *pdVar35) {
                                  pdVar35 = pdVar34;
                                }
                                iVar33 = 0;
                                if (local_138 < *pdVar35 || local_138 == *pdVar35) {
                                  uStack_3e0 = 0;
                                  auVar12._8_4_ = SUB84(dVar48 - dVar53,0);
                                  auVar12._0_8_ = dVar54 - dVar48;
                                  auVar12._12_4_ = (int)((ulong)(dVar48 - dVar53) >> 0x20);
                                  uStack_3f0 = 0;
                                  local_3d8 = dVar47 - dVar46;
                                  dStack_3d0 = dVar46 - dVar45;
                                  uStack_3a0 = 0;
                                  dVar19 = dVar43 - dVar44;
                                  dVar20 = dVar49 - dVar43;
                                  uVar42 = (undefined4)((ulong)dVar20 >> 0x20);
                                  uStack_330 = 0;
                                  dVar59 = dVar53 * dVar44 - dVar54 * dVar49;
                                  dVar11 = dVar53 * dVar47 - dVar54 * dVar45;
                                  local_358._0_8_ = dVar49 * dVar47 - dVar44 * dVar45;
                                  uStack_390 = 0;
                                  local_3b8._0_8_ = dVar45 - dVar47;
                                  uStack_380 = 0;
                                  local_348 = dVar44 - dVar49;
                                  dVar15 = dVar48 * dVar49 - dVar53 * dVar43;
                                  dVar50 = dVar48 * dVar45 - dVar53 * dVar46;
                                  local_3c8 = dVar46 * dVar44 - dVar43 * dVar47;
                                  dStack_3c0 = dVar45 * dVar43 - dVar49 * dVar46;
                                  auVar17._8_4_ = SUB84(dVar20,0);
                                  auVar17._0_8_ = dVar19;
                                  auVar17._12_4_ = uVar42;
                                  dStack_480 = auVar12._8_8_;
                                  dVar56 = (double)local_168._0_8_ *
                                           (dVar54 * dVar46 - dVar48 * dVar47) +
                                           (double)local_198._0_8_ *
                                           (dVar54 * dVar43 - dVar48 * dVar44) +
                                           (double)local_178._0_8_ * (dVar54 - dVar48) +
                                           local_108 * local_3c8 +
                                           local_118 * local_3d8 + (double)local_128._0_8_ * dVar19;
                                  dVar57 = (double)local_168._8_8_ * dVar50 +
                                           (double)local_198._8_8_ * dVar15 +
                                           (double)local_178._8_8_ * dStack_480 +
                                           dStack_100 * dStack_3c0 +
                                           dStack_110 * dStack_3d0 +
                                           (double)local_128._8_8_ * dVar20;
                                  uStack_340 = 0;
                                  local_3b8._8_8_ = 0;
                                  local_358._8_8_ = 0;
                                  dVar55 = dVar53 - dVar54;
                                  dVar60 = local_158 * dVar11 +
                                           (double)local_188._0_8_ * dVar59 +
                                           (double)local_148._0_8_ * dVar55 +
                                           local_f8 * (double)local_358._0_8_ +
                                           local_d8 * (double)local_3b8._0_8_ +
                                           (double)local_e8._0_8_ * local_348;
                                  auVar21._8_8_ = -(ulong)(ABS(dVar57) < 2.220446049250313e-16);
                                  auVar21._0_8_ = -(ulong)(ABS(dVar56) < 2.220446049250313e-16);
                                  uVar31 = movmskpd((int)pdVar34,auVar21);
                                  dVar58 = ABS(dVar60);
                                  bVar29 = (byte)uVar31;
                                  dStack_4c0 = auVar17._8_8_;
                                  dVar25 = dStack_4c0;
                                  local_3f8 = dVar46;
                                  local_3e8 = dVar48;
                                  local_3a8 = dVar43;
                                  local_398 = dVar45;
                                  local_388 = dVar49;
                                  local_338 = dVar53;
                                  if ((((uVar31 & 1) == 0) ||
                                      (iVar33 = CONCAT31((int3)(uVar31 >> 8),bVar29 >> 1),
                                      bVar29 >> 1 == 0)) || (2.220446049250313e-16 <= dVar58)) {
                                    dVar53 = -dVar47;
                                    if (((0.0 <= dVar60) || (0.0 <= dVar56)) || (0.0 <= dVar57)) {
                                      auVar16._8_4_ = (int)-(ulong)(0.0 < dVar57);
                                      auVar16._0_8_ = -(ulong)(0.0 < dVar56);
                                      auVar16._12_4_ = (int)(-(ulong)(0.0 < dVar57) >> 0x20);
                                      iVar33 = movmskpd(iVar33,auVar16);
                                      if ((((0.0 < dVar60) && (iVar33 == 3)) ||
                                          (((bVar29 & 0.0 < dVar57 * dVar60) != 0 ||
                                           ((ABS(dVar57) < 2.220446049250313e-16 &&
                                            (0.0 < dVar60 * dVar56)))))) ||
                                         ((dVar58 < 2.220446049250313e-16 && (0.0 < dVar57 * dVar56)
                                          ))) goto LAB_0076210b;
                                      if ((2.220446049250313e-16 <= ABS(dVar57)) ||
                                         (2.220446049250313e-16 <= dVar58 && (uVar31 & 1) == 0)) {
                                        iVar33 = 0;
                                        if ((~bVar29 & 1) == 0 && dVar58 < 2.220446049250313e-16) {
                                          if (0.0 < (local_348 *
                                                     (dVar18 * dVar46 +
                                                     dVar48 * (double)local_218._8_8_) +
                                                    (double)local_3b8._0_8_ *
                                                    (dVar18 * dVar43 +
                                                    (double)local_1f8._8_8_ * dVar48) +
                                                    (double)local_358._0_8_ * (dVar18 - dVar48) +
                                                    dVar55 * (dVar10 * dVar46 +
                                                             (double)local_218._8_8_ * dVar43) +
                                                    dVar59 * ((double)local_268._8_8_ - dVar46) +
                                                    dVar11 * (dVar43 - dVar10)) *
                                                    (local_348 * (dVar48 * dVar7 + dVar5 * -dVar46)
                                                    + (double)local_3b8._0_8_ *
                                                      (dVar48 * dVar6 + -dVar43 * dVar5) +
                                                      (double)local_358._0_8_ * (dVar48 - dVar5) +
                                                      dVar55 * (dVar43 * dVar7 + -dVar46 * dVar6) +
                                                      dVar59 * (dVar46 - dVar7) +
                                                      dVar11 * (dVar6 - dVar43))) goto LAB_00762923;
                                        }
                                        goto LAB_00762928;
                                      }
                                      dVar54 = (dStack_4c0 * (dVar18 * dVar47 + dVar54 * local_208)
                                               + dStack_3d0 * (dVar18 * dVar44 + local_1e8 * dVar54)
                                                 + dStack_3c0 * (dVar18 - dVar54) +
                                                   dStack_480 *
                                                   (dVar10 * dVar47 + local_208 * dVar44) +
                                                   dVar15 * ((double)local_268._8_8_ - dVar47) +
                                                   dVar50 * (dVar44 - dVar10)) *
                                               (dStack_4c0 * (dVar54 * dVar7 + dVar5 * dVar53) +
                                               dStack_3d0 * (dVar54 * dVar6 + -dVar44 * dVar5) +
                                               dStack_3c0 * (dVar54 - dVar5) +
                                               dStack_480 * (dVar44 * dVar7 + dVar53 * dVar6) +
                                               dVar15 * (dVar47 - dVar7) + dVar50 * (dVar6 - dVar44)
                                               );
                                    }
                                    else {
LAB_0076210b:
                                      dVar54 = (dStack_4c0 *
                                                (dVar5 * dVar47 + dVar54 * (double)local_2b8._0_8_)
                                               + dStack_3d0 * (dVar5 * dVar44 + local_228 * dVar54)
                                                 + dStack_3c0 * (dVar5 - dVar54) +
                                                   dStack_480 *
                                                   (dVar6 * dVar47 +
                                                   (double)local_2b8._0_8_ * dVar44) +
                                                   dVar15 * (dVar7 - dVar47) +
                                                   dVar50 * (dVar44 - dVar6)) *
                                               (dStack_4c0 * (dVar54 * dVar14 + dVar18 * dVar53) +
                                               dStack_3d0 * (dVar54 * dVar10 + -dVar44 * dVar18) +
                                               dStack_3c0 * (dVar54 - dVar18) +
                                               dStack_480 * (dVar44 * dVar14 + dVar53 * dVar10) +
                                               dVar15 * (dVar47 - dVar14) +
                                               dVar50 * (dVar10 - dVar44));
                                    }
                                    iVar33 = 0;
                                    if (dVar54 <= 0.0) goto LAB_00762928;
                                  }
                                  else {
                                    dVar48 = dVar48 - dVar54;
                                    dVar46 = dVar46 - dVar47;
                                    dVar43 = dVar19 * (double)local_3b8._0_8_ -
                                             (dVar49 - dVar44) * dVar46;
                                    dVar45 = dVar46 * dVar55 - (double)local_3b8._0_8_ * dVar48;
                                    local_3b8._8_4_ = 0;
                                    local_3b8._0_8_ = -dVar46;
                                    local_3b8._12_4_ = 0x80000000;
                                    dVar53 = (dVar49 - dVar44) * dVar48 - dVar55 * dVar19;
                                    local_3c8 = -dVar48;
                                    dStack_3c0 = -0.0;
                                    dVar53 = dVar53 * dVar53 + dVar43 * dVar43 + dVar45 * dVar45;
                                    local_3d8 = -dVar19;
                                    dStack_3d0 = -dStack_4c0;
                                    local_2c8._8_8_ = 0;
                                    local_2c8._0_8_ = dVar48;
                                    if (dVar53 < 0.0) {
                                      dVar53 = sqrt(dVar53);
                                      dVar48 = (double)local_2c8._0_8_;
                                    }
                                    else {
                                      dVar53 = SQRT(dVar53);
                                    }
                                    dVar49 = dVar19 * (dVar7 - dVar47) +
                                             (dVar6 - dVar44) * (double)local_3b8._0_8_;
                                    dVar43 = dVar46 * (dVar5 - dVar54) +
                                             (dVar7 - dVar47) * local_3c8;
                                    dVar48 = (dVar5 - dVar54) * local_3d8 +
                                             dVar48 * (dVar6 - dVar44);
                                    dVar48 = dVar48 * dVar48 + dVar49 * dVar49 + dVar43 * dVar43;
                                    local_370 = dVar53 * 0.5;
                                    if (dVar48 < 0.0) {
                                      dVar48 = sqrt(dVar48);
                                      uVar51 = extraout_XMM0_Dc;
                                      uVar52 = extraout_XMM0_Dd;
                                    }
                                    else {
                                      uVar51 = 0;
                                      uVar52 = 0;
                                      dVar48 = SQRT(dVar48);
                                    }
                                    local_2d8 = local_338 - local_3e8;
                                    dVar53 = local_398 - local_3f8;
                                    dVar49 = dStack_4c0 * (dVar7 - local_3f8) -
                                             (dVar6 - local_3a8) * dVar53;
                                    local_358._8_4_ = (int)uStack_390;
                                    local_358._0_8_ = dVar53;
                                    local_358._12_4_ = (int)((ulong)uStack_390 >> 0x20);
                                    dVar43 = dVar53 * (dVar5 - local_3e8) -
                                             (dVar7 - local_3f8) * local_2d8;
                                    auVar13._8_4_ = SUB84(dVar20,0);
                                    auVar13._0_8_ = dStack_4c0;
                                    auVar13._12_4_ = uVar42;
                                    dVar53 = local_2d8 * (dVar6 - local_3a8) -
                                             (dVar5 - local_3e8) * dStack_4c0;
                                    dVar53 = dVar53 * dVar53 + dVar49 * dVar49 + dVar43 * dVar43;
                                    local_1a8._8_4_ = uVar51;
                                    local_1a8._0_8_ = dVar48 * 0.5;
                                    local_1a8._12_4_ = uVar52;
                                    uStack_2d0 = uStack_330;
                                    if (dVar53 < 0.0) {
                                      dVar53 = sqrt(dVar53);
                                    }
                                    else {
                                      dVar53 = SQRT(dVar53);
                                    }
                                    local_2e8 = dVar54 - local_338;
                                    local_258 = dVar47 - local_398;
                                    dVar49 = local_348 * (dVar7 - local_398) -
                                             (dVar6 - local_388) * local_258;
                                    uStack_250 = 0;
                                    dVar43 = local_258 * (dVar5 - local_338) -
                                             (dVar7 - local_398) * local_2e8;
                                    dVar48 = local_2e8 * (dVar6 - local_388) -
                                             (dVar5 - local_338) * local_348;
                                    local_1b8 = -(double)local_358._0_8_;
                                    uStack_1b0 = local_358._8_8_ ^ 0x8000000000000000;
                                    local_1c8 = -local_2d8;
                                    uStack_1c0 = uStack_2d0 ^ 0x8000000000000000;
                                    dVar48 = dVar48 * dVar48 + dVar49 * dVar49 + dVar43 * dVar43;
                                    dStack_4c0 = auVar13._8_8_;
                                    local_1d8 = -dVar25;
                                    uStack_1d0 = (ulong)dStack_4c0 ^ 0x8000000000000000;
                                    local_378 = dVar53 * 0.5;
                                    uStack_2e0 = 0;
                                    if (dVar48 < 0.0) {
                                      dVar48 = sqrt(dVar48);
                                    }
                                    else {
                                      dVar48 = SQRT(dVar48);
                                    }
                                    dVar43 = dVar19 * (dVar14 - dVar47) +
                                             (double)local_3b8._0_8_ * (dVar10 - dVar44);
                                    dVar53 = dVar46 * (dVar18 - dVar54) +
                                             (dVar14 - dVar47) * local_3c8;
                                    dVar54 = (double)local_2c8._0_8_ * (dVar10 - dVar44) +
                                             (dVar18 - dVar54) * local_3d8;
                                    dVar44 = -local_258;
                                    dVar49 = -local_2e8;
                                    dVar54 = dVar54 * dVar54 + dVar43 * dVar43 + dVar53 * dVar53;
                                    dVar53 = -local_348;
                                    if (dVar54 < 0.0) {
                                      dVar54 = sqrt(dVar54);
                                    }
                                    else {
                                      dVar54 = SQRT(dVar54);
                                    }
                                    dVar47 = dVar25 * (dVar14 - local_3f8) +
                                             local_1b8 * (dVar10 - local_3a8);
                                    dVar46 = (double)local_358._0_8_ * (dVar18 - local_3e8) +
                                             (dVar14 - local_3f8) * local_1c8;
                                    dVar43 = local_2d8 * (dVar10 - local_3a8) +
                                             (dVar18 - local_3e8) * local_1d8;
                                    dVar43 = dVar43 * dVar43 + dVar47 * dVar47 + dVar46 * dVar46;
                                    if (dVar43 < 0.0) {
                                      dVar43 = sqrt(dVar43);
                                    }
                                    else {
                                      dVar43 = SQRT(dVar43);
                                    }
                                    dVar47 = local_348 * (dVar14 - local_398) +
                                             dVar44 * (dVar10 - local_388);
                                    dVar44 = local_258 * (dVar18 - local_338) +
                                             (dVar14 - local_398) * dVar49;
                                    dVar53 = local_2e8 * (dVar10 - local_388) +
                                             (dVar18 - local_338) * dVar53;
                                    dVar53 = dVar53 * dVar53 + dVar47 * dVar47 + dVar44 * dVar44;
                                    if (dVar53 < 0.0) {
                                      dVar53 = sqrt(dVar53);
                                    }
                                    else {
                                      dVar53 = SQRT(dVar53);
                                    }
                                    if ((ABS(((double)local_1a8._0_8_ + local_378 + dVar48 * 0.5) -
                                             local_370) <= 2.220446049250313e-16) &&
                                       (iVar33 = 0,
                                       ABS((dVar54 * 0.5 + dVar43 * 0.5 + dVar53 * 0.5) - local_370)
                                       <= 2.220446049250313e-16)) goto LAB_00762928;
                                  }
LAB_00762923:
                                  iVar33 = 1;
                                }
                              }
                            }
                          }
                        }
                      }
LAB_00762928:
                      uVar39 = uVar39 + iVar33;
                      lVar40 = lVar40 + 0x48;
                    } while ((ulong)uVar8 * 0x48 != lVar40);
                    pRVar36 = &local_410;
                    if ((uVar39 & 1) == 0) {
                      pRVar36 = &local_408;
                    }
                    uVar42 = SUB84(local_360,0);
                    uVar51 = (undefined4)((ulong)local_360 >> 0x20);
                    lVar40 = local_278;
                    dVar54 = local_238;
                    dVar48 = local_248;
                    dVar53 = local_368;
                    iVar33 = local_3fc;
                  }
                  pAVar37->p
                  [(local_270 - (pAVar37->begin).y) * pAVar37->jstride +
                   ((long)iVar38 - (long)(pAVar37->begin).x) +
                   (lVar40 - (pAVar37->begin).z) * pAVar37->kstride] = *pRVar36;
                  bVar41 = iVar38 != iVar33;
                  iVar38 = iVar38 + 1;
                } while (bVar41);
              }
              bVar41 = iVar23 != iVar28;
              iVar23 = iVar23 + 1;
            } while (bVar41);
          }
          local_420 = (ulong)(iVar30 + 1);
        } while (iVar30 != local_400);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  Gpu::Device::streamSynchronize();
  return;
}

Assistant:

void
STLtools::fill (MultiFab& mf, IntVect const& nghost, Geometry const& geom,
                Real outside_value, Real inside_value) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? outside_value :  inside_value;
    Real other_value     = m_boundry_is_outside ?  inside_value : outside_value;

    auto const& ma = mf.arrays();

    ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        ma[box_no](i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
    Gpu::streamSynchronize();
}